

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (Option *this,string_view name,string_view value,bool ignoreDup)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  anon_class_32_4_b7d0904a *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t in_R8;
  char *in_R9;
  __sv_type _Var2;
  byte in_stack_00000008;
  path path;
  error_code ec;
  string pathMem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  path *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string_view **ppsVar3;
  undefined7 in_stack_fffffffffffffed8;
  byte bVar4;
  char *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffef0;
  format fVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef8;
  path *in_stack_ffffffffffffff00;
  char *local_f8;
  error_code local_e0 [2];
  path local_b8;
  error_code local_90 [2];
  size_t local_70;
  char *local_68;
  bitmask<slang::CommandLineFlags> local_5c [10];
  byte local_31;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  
  fVar5 = (format)((ulong)in_stack_fffffffffffffef0 >> 0x38);
  local_31 = in_stack_00000008 & 1;
  this_00 = in_RDI;
  local_28[0]._M_len = in_R8;
  local_28[0]._M_str = in_R9;
  std::__cxx11::string::string(in_RDI);
  ppsVar3 = &in_RSI[4].name;
  bitmask<slang::CommandLineFlags>::bitmask(local_5c,FilePath);
  bVar1 = bitmask<slang::CommandLineFlags>::has
                    ((bitmask<slang::CommandLineFlags> *)in_stack_fffffffffffffeb0,
                     (bitmask<slang::CommandLineFlags> *)in_stack_fffffffffffffea8);
  bVar4 = 0;
  if (bVar1) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_28);
    bVar4 = 0;
    if (!bVar1) {
      local_70 = local_28[0]._M_len;
      local_68 = local_28[0]._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x._M_len._7_1_ = bVar4;
      __x._M_len._0_7_ = in_stack_fffffffffffffed8;
      __x._M_str = in_stack_fffffffffffffee0;
      __y._M_str = (char *)ppsVar3;
      __y._M_len = (size_t)in_RSI;
      bVar1 = std::operator==(__x,__y);
      bVar4 = bVar1 ^ 0xff;
    }
  }
  if ((bVar4 & 1) != 0) {
    std::error_code::error_code((error_code *)in_stack_fffffffffffffeb0);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,fVar5);
    std::filesystem::weakly_canonical(&local_b8,local_e0);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffeb0);
    bVar1 = std::error_code::operator_cast_to_bool(local_90);
    if (!bVar1) {
      in_stack_fffffffffffffeb0 = (path *)getU8Str((path *)0x3ed235);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                        (&in_stack_fffffffffffffeb0->_M_pathname);
      local_28[0]._M_len = _Var2._M_len;
      local_f8 = _Var2._M_str;
      local_28[0]._M_str = local_f8;
    }
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffeb0);
  }
  std::
  visit<slang::CommandLine::Option::set[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>&>
            (in_RSI,(variant<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                     *)this_00);
  std::__cxx11::string::~string(&in_stack_fffffffffffffeb0->_M_pathname);
  return this_00;
}

Assistant:

std::string CommandLine::Option::set(std::string_view name, std::string_view value,
                                     bool ignoreDup) {
    std::string pathMem;
    if (flags.has(CommandLineFlags::FilePath) && !value.empty() && value != "-") {
        std::error_code ec;
        fs::path path = fs::weakly_canonical(value, ec);
        if (!ec) {
            pathMem = getU8Str(path);
            value = pathMem;
        }
    }

    return std::visit(
        [&](auto&& arg) {
            if constexpr (std::is_same_v<OptionCallback, std::decay_t<decltype(arg)>>) {
                return set(arg, name, value);
            }
            else {
                if (!allowValue(*arg)) {
                    if (ignoreDup)
                        return std::string();
                    return fmt::format("more than one value provided for argument '{}'"sv, name);
                }
                return set(*arg, name, value);
            }
        },
        storage);
}